

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result
cb_tlv_address(rfc5444_reader_tlvblock_entry *tlv,rfc5444_reader_tlvblock_context *ctx)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int ti;
  uint8_t ai;
  uint8_t *addr;
  int oi;
  rfc5444_reader_tlvblock_context *ctx_local;
  rfc5444_reader_tlvblock_entry *tlv_local;
  
  iVar3 = ctx->consumer->order + -1;
  bVar2 = (ctx->addr)._addr[3] - 1;
  iVar4 = tlv->type - 1;
  printf("%s: message tlv %d (order %d): %d\n","cb_tlv_address",(ulong)tlv->type,
         (ulong)(uint)ctx->consumer->order,(ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_tlv_address[iVar3][bVar2][iVar4] = callback_index;
  callback_index = iVar1;
  return result_tlv_address[iVar3][bVar2][iVar4];
}

Assistant:

static enum rfc5444_result
cb_tlv_address(struct rfc5444_reader_tlvblock_entry *tlv,
    struct rfc5444_reader_tlvblock_context *ctx) {
  int oi = ctx->consumer->order - 1;
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;
  int ti = tlv->type - 1;

#ifdef PRINT_CB
  printf("%s: message tlv %d (order %d): %d\n",
      __func__, tlv->type, ctx->consumer->order, callback_index);
#endif
  idxcb_tlv_address[oi][ai][ti] = callback_index++;
  return result_tlv_address[oi][ai][ti];
}